

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

Parser * xLearn::CreateParser(char *format_name)

{
  Parser *pPVar1;
  char *in_RDI;
  string *in_stack_ffffffffffffffc0;
  ObjectCreatorRegistry_xLearn_parser_registry *in_stack_ffffffffffffffc8;
  allocator local_29;
  string local_28 [32];
  char *local_8;
  
  local_8 = in_RDI;
  GetRegistry_xLearn_parser_registry();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,local_8,&local_29);
  pPVar1 = ObjectCreatorRegistry_xLearn_parser_registry::CreateObject
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return pPVar1;
}

Assistant:

Parser* CreateParser(const char* format_name) {
  return CREATE_PARSER(format_name);
}